

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_functionActivationEnvironment_create
          (sysbvm_context_t *context,sysbvm_tuple_t parent,sysbvm_tuple_t function)

{
  long lVar1;
  undefined8 uVar2;
  _Bool _Var3;
  sysbvm_object_tuple_t *psVar4;
  size_t value;
  size_t sVar5;
  sysbvm_tuple_t sVar6;
  size_t localCount;
  size_t argumentCount;
  sysbvm_functionActivationEnvironment_t *result;
  sysbvm_functionSourceAnalyzedDefinition_t *sourceAnalyzedDefinition;
  sysbvm_functionDefinition_t *functionDefinitionObject;
  sysbvm_function_t *functionObject;
  sysbvm_tuple_t function_local;
  sysbvm_tuple_t parent_local;
  sysbvm_context_t *context_local;
  
  if (function != 0) {
    _Var3 = sysbvm_tuple_isFunction(context,function);
    if (_Var3) goto LAB_001298d8;
  }
  sysbvm_error("Expected a function");
LAB_001298d8:
  if (*(long *)(function + 0x48) == 0) {
    sysbvm_error("Expected a function with a definition.");
  }
  lVar1 = *(long *)(function + 0x48);
  if (*(long *)(lVar1 + 0x78) == 0) {
    sysbvm_error("Expected an analyzed source definition");
  }
  lVar1 = *(long *)(lVar1 + 0x78);
  psVar4 = sysbvm_context_allocatePointerTuple
                     (context,(context->roots).functionActivationEnvironmentType,0x13);
  psVar4[2].header.field_0.typePointer = parent;
  psVar4[5].header.field_0.typePointer = function;
  uVar2 = *(undefined8 *)(function + 0x48);
  psVar4[5].header.identityHashAndFlags = (int)uVar2;
  psVar4[5].header.objectSize = (int)((ulong)uVar2 >> 0x20);
  uVar2 = *(undefined8 *)(function + 0x38);
  psVar4[6].header.identityHashAndFlags = (int)uVar2;
  psVar4[6].header.objectSize = (int)((ulong)uVar2 >> 0x20);
  value = sysbvm_array_getSize(*(sysbvm_tuple_t *)(lVar1 + 0x28));
  sVar5 = sysbvm_array_getSize(*(sysbvm_tuple_t *)(lVar1 + 0x30));
  sVar6 = sysbvm_tuple_size_encode(context,value);
  psVar4[6].header.field_0.typePointer = sVar6;
  sVar6 = sysbvm_array_create(context,value + sVar5);
  psVar4[6].field_1.pointers[0] = sVar6;
  return (sysbvm_tuple_t)psVar4;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_functionActivationEnvironment_create(sysbvm_context_t *context, sysbvm_tuple_t parent, sysbvm_tuple_t function)
{
    if(!function || !sysbvm_tuple_isFunction(context, function))
        sysbvm_error("Expected a function");

    sysbvm_function_t *functionObject = (sysbvm_function_t*)function;
    if(!functionObject->definition)
        sysbvm_error("Expected a function with a definition.");

    sysbvm_functionDefinition_t *functionDefinitionObject = (sysbvm_functionDefinition_t*)functionObject->definition;
    if(!functionDefinitionObject->sourceAnalyzedDefinition)
        sysbvm_error("Expected an analyzed source definition");

    sysbvm_functionSourceAnalyzedDefinition_t *sourceAnalyzedDefinition = (sysbvm_functionSourceAnalyzedDefinition_t*)functionDefinitionObject->sourceAnalyzedDefinition;

    sysbvm_functionActivationEnvironment_t *result = (sysbvm_functionActivationEnvironment_t*)sysbvm_context_allocatePointerTuple(context, context->roots.functionActivationEnvironmentType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_functionActivationEnvironment_t));
    result->super.super.parent = parent;
    result->function = function;
    result->functionDefinition = functionObject->definition;
    result->captureVector = functionObject->captureVector;
    
    size_t argumentCount = sysbvm_array_getSize(sourceAnalyzedDefinition->arguments);
    size_t localCount = sysbvm_array_getSize(sourceAnalyzedDefinition->locals);
    result->argumentVectorSize = sysbvm_tuple_size_encode(context, argumentCount);
    result->valueVector = sysbvm_array_create(context, argumentCount + localCount);
    return (sysbvm_tuple_t)result;
}